

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O2

void __thiscall spirv_cross::CFG::CFG(CFG *this,Compiler *compiler_,SPIRFunction *func_)

{
  this->compiler = compiler_;
  this->func = func_;
  (this->preceding_edges)._M_h._M_buckets = &(this->preceding_edges)._M_h._M_single_bucket;
  (this->preceding_edges)._M_h._M_bucket_count = 1;
  (this->preceding_edges)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->preceding_edges)._M_h._M_element_count = 0;
  (this->preceding_edges)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->preceding_edges)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->preceding_edges)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->succeeding_edges)._M_h._M_buckets = &(this->succeeding_edges)._M_h._M_single_bucket;
  (this->succeeding_edges)._M_h._M_bucket_count = 1;
  (this->succeeding_edges)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->succeeding_edges)._M_h._M_element_count = 0;
  (this->succeeding_edges)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->succeeding_edges)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->succeeding_edges)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->immediate_dominators)._M_h._M_buckets = &(this->immediate_dominators)._M_h._M_single_bucket
  ;
  (this->immediate_dominators)._M_h._M_bucket_count = 1;
  (this->immediate_dominators)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->immediate_dominators)._M_h._M_element_count = 0;
  (this->immediate_dominators)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->immediate_dominators)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->immediate_dominators)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->visit_order)._M_h._M_buckets = &(this->visit_order)._M_h._M_single_bucket;
  (this->visit_order)._M_h._M_bucket_count = 1;
  (this->visit_order)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->visit_order)._M_h._M_element_count = 0;
  (this->visit_order)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->visit_order)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->visit_order)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->post_order).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->post_order).super_VectorView<unsigned_int>.ptr = (uint *)&(this->post_order).stack_storage;
  (this->post_order).buffer_capacity = 8;
  (this->empty_vector).super_VectorView<unsigned_int>.buffer_size = 0;
  (this->empty_vector).super_VectorView<unsigned_int>.ptr =
       (uint *)&(this->empty_vector).stack_storage;
  (this->empty_vector).buffer_capacity = 8;
  this->visit_count = 0;
  build_post_order_visit_order(this);
  build_immediate_dominators(this);
  return;
}

Assistant:

CFG::CFG(Compiler &compiler_, const SPIRFunction &func_)
    : compiler(compiler_)
    , func(func_)
{
	build_post_order_visit_order();
	build_immediate_dominators();
}